

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_tun.c
# Opt level: O1

int csp_if_tun_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  ulong *puVar1;
  int iVar2;
  csp_packet_t *packet_00;
  undefined1 auVar3 [16];
  
  puVar1 = (ulong *)iface->driver_data;
  packet_00 = csp_buffer_get_always();
  if (packet_00 == (csp_packet_t *)0x0) {
    csp_buffer_free(packet);
  }
  else {
    if ((uint)*puVar1 == (uint)(packet->id).dst) {
      csp_id_setup_rx(packet_00);
      iVar2 = csp_crypto_decrypt((packet->field_5).data,(uint8_t)packet->length,
                                 (packet_00->field_0).field_1.frame_begin);
      if (iVar2 < 0) {
        csp_buffer_free(packet_00);
        csp_buffer_free(packet);
        iface->rx_error = iface->rx_error + 1;
        return 0;
      }
      (packet_00->field_0).field_1.frame_length = (uint16_t)iVar2;
      csp_buffer_free(packet);
      csp_id_strip(packet_00);
    }
    else {
      csp_id_prepend(packet);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *puVar1;
      auVar3 = pshuflw(auVar3,auVar3,0xe8);
      (packet_00->id).src = (short)auVar3._0_4_;
      (packet_00->id).dst = (short)((uint)auVar3._0_4_ >> 0x10);
      (packet_00->id).dport = '\0';
      (packet_00->id).sport = '\0';
      (packet_00->id).pri = (packet->id).pri;
      packet_00->length = (packet->field_0).field_1.frame_length;
      iVar2 = csp_crypto_encrypt((packet->field_0).field_1.frame_begin,
                                 *(uint8_t *)((long)&packet->field_0 + 0x18),
                                 (packet_00->field_5).data);
      packet_00->length = (uint16_t)iVar2;
      csp_buffer_free(packet);
      csp_id_prepend(packet_00);
    }
    csp_qfifo_write(packet_00,iface,(void *)0x0);
  }
  return 0;
}

Assistant:

static int csp_if_tun_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_if_tun_conf_t * ifconf = iface->driver_data;

	/* Allocate new frame */
	csp_packet_t * new_packet = csp_buffer_get_always();
	if (new_packet == NULL) {
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	if (packet->id.dst == ifconf->tun_src) {

		/**
		 * Incomming tunnel packet
		 */
		//csp_hex_dump("incoming packet", packet->data, packet->length);

		csp_id_setup_rx(new_packet);

#if 1
		int length = csp_crypto_decrypt(packet->data, packet->length, new_packet->frame_begin);
		if (length < 0) {
			csp_buffer_free(new_packet);
			csp_buffer_free(packet);
			iface->rx_error++;
			return CSP_ERR_NONE;
		} else {
			new_packet->frame_length = length;
		}
#else
		/* Decapsulate */
		memcpy(new_packet->frame_begin, packet->data, packet->length);
		new_packet->frame_length = packet->length;
#endif

		/* Now free old packet */
		csp_buffer_free(packet);

		//csp_hex_dump("new frame", new_packet->frame_begin, new_packet->frame_length + 16);

		csp_id_strip(new_packet);

		//csp_hex_dump("new packet", new_packet->data, new_packet->length);

		/* Send new packet */
		csp_qfifo_write(new_packet, iface, NULL);

	} else {

		/**
		 * Outgoing tunnel packet
		 */

		//csp_hex_dump("packet", packet->data, packet->length);

		/* Apply CSP header */
		csp_id_prepend(packet);

		//csp_hex_dump("frame", packet->frame_begin, packet->frame_length);

		/* Create tunnel header */
		new_packet->id.dst = ifconf->tun_dst;
		new_packet->id.src = ifconf->tun_src;
		new_packet->id.sport = 0;
		new_packet->id.dport = 0;
		new_packet->id.pri = packet->id.pri;
		new_packet->length = packet->frame_length;

#if 1
		/* Encrypt */
		new_packet->length = csp_crypto_encrypt(packet->frame_begin, packet->frame_length, new_packet->data);
#else
		/* Encapsulate */
		memcpy(new_packet->data, packet->frame_begin, packet->frame_length);
#endif

		/* Free old packet */
		csp_buffer_free(packet);

		//csp_hex_dump("new packet", new_packet->data, new_packet->length);

		/* Apply CSP header */
		csp_id_prepend(new_packet);

		//csp_hex_dump("new frame", new_packet->frame_begin, new_packet->frame_length);

		/* Send new packet */
		csp_qfifo_write(new_packet, iface, NULL);

	}

	return CSP_ERR_NONE;

}